

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int SDL_SetGamma(float red,float green,float blue)

{
  int iVar1;
  Uint16 *pUVar2;
  Uint16 blue_ramp [256];
  Uint16 green_ramp [256];
  Uint16 red_ramp [256];
  Uint16 local_608 [256];
  Uint16 local_408 [256];
  Uint16 local_208 [260];
  
  (*SDL20_CalculateGammaRamp)(red,local_208);
  if ((green != red) || (NAN(green) || NAN(red))) {
    (*SDL20_CalculateGammaRamp)(green,local_408);
  }
  else {
    (*SDL20_memcpy)(local_408,local_208,0x200);
  }
  if ((blue != red) || (NAN(blue) || NAN(red))) {
    if ((blue != green) || (NAN(blue) || NAN(green))) {
      (*SDL20_CalculateGammaRamp)(blue,local_608);
      goto LAB_0010e01e;
    }
    pUVar2 = local_408;
  }
  else {
    pUVar2 = local_208;
  }
  (*SDL20_memcpy)(local_608,pUVar2,0x200);
LAB_0010e01e:
  iVar1 = (*SDL20_SetWindowGammaRamp)(VideoWindow20,local_208,local_408,local_608);
  return iVar1;
}

Assistant:

SDLCALL
SDL_SetGamma(float red, float green, float blue)
{
    Uint16 red_ramp[256];
    Uint16 green_ramp[256];
    Uint16 blue_ramp[256];

    SDL20_CalculateGammaRamp(red, red_ramp);
    if (green == red) {
        SDL20_memcpy(green_ramp, red_ramp, sizeof(red_ramp));
    } else {
        SDL20_CalculateGammaRamp(green, green_ramp);
    }
    if (blue == red) {
        SDL20_memcpy(blue_ramp, red_ramp, sizeof(red_ramp));
    } else if (blue == green) {
        SDL20_memcpy(blue_ramp, green_ramp, sizeof(green_ramp));
    } else {
        SDL20_CalculateGammaRamp(blue, blue_ramp);
    }

    return SDL20_SetWindowGammaRamp(VideoWindow20, red_ramp, green_ramp, blue_ramp);
}